

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  pointer pUVar1;
  ostream *poVar2;
  pointer user;
  code *local_40;
  undefined8 local_38;
  offset_in_User_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Users:\n",7);
  pUVar1 = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data._M_start
      != users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    user = users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
           _M_start;
    do {
      poVar2 = operator<<((ostream *)&std::cout,user);
      local_40 = (code *)CONCAT71(local_40._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_40,1);
      user = user + 1;
    } while (user != pUVar1);
  }
  local_40 = (code *)CONCAT71(local_40._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Superusers:\n",0xc);
  local_40 = (code *)0x20;
  local_30 = 0;
  print_if<__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,bool_User::*,std::__cxx11::string_User::*>
            ((__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
             users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
                      users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                      super__Vector_impl_data._M_finish,(offset_in_User_to_bool *)&local_40,
             &local_30);
  local_40 = (code *)CONCAT71(local_40._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Regular users:\n",0xf);
  local_40 = User::is_regular_user;
  local_38 = 0;
  local_30 = 0;
  print_if<__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,__gnu_cxx::__normal_iterator<User_const*,std::vector<User,std::allocator<User>>>,bool(User::*)()noexcept_const,std::__cxx11::string_User::*>
            ((__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
             users.super__Vector_base<User,_std::allocator<User>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<const_User_*,_std::vector<User,_std::allocator<User>_>_>)
                      users.super__Vector_base<User,_std::allocator<User>_>._M_impl.
                      super__Vector_impl_data._M_finish,(offset_in_User_to_subr *)&local_40,
             &local_30);
  local_40 = (code *)CONCAT71(local_40._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_40,1);
  return 0;
}

Assistant:

int main()
{
    /// print all users
    ///
    /// `eggs::invoke(<lambda>, user)` is equivalent to `<lambda>(user)`.
    std::cout << "Users:\n";
    print_if(users.begin(), users.end(), [](User const&) { return true; });
    std::cout << '\n';

    /// print the names of superusers
    ///
    /// `eggs::invoke(&User::is_superuser, user)` is equivalent to
    /// `user.is_superuser` or `user->is_superuser`.
    std::cout << "Superusers:\n";
    print_if(users.begin(), users.end(), &User::is_superuser, &User::name);
    std::cout << '\n';

    /// print the names of regular users
    ///
    /// `eggs::invoke(&User::is_regular_user, user)` is equivalent to
    /// `user.is_regular_user()` or `user->is_regular_user()`.
    std::cout << "Regular users:\n";
    print_if(users.begin(), users.end(), &User::is_regular_user, &User::name);
    std::cout << '\n';

    return 0;
}